

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O0

uint8_t * __thiscall google::protobuf::io::EpsCopyOutputStream::Next(EpsCopyOutputStream *this)

{
  undefined8 uVar1;
  int iVar2;
  uint8_t *puVar3;
  LogMessage *pLVar4;
  LogMessage local_78;
  Voidify local_61;
  EpsCopyOutputStream *local_60;
  void *data;
  EpsCopyOutputStream *pEStack_50;
  int size;
  uint8_t *ptr;
  byte local_31;
  LogMessage local_30;
  Voidify local_19;
  EpsCopyOutputStream *local_18;
  EpsCopyOutputStream *this_local;
  
  local_31 = 0;
  local_18 = this;
  if ((this->had_error_ & 1U) != 0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_30,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.cc"
               ,0x34d,"!had_error_");
    local_31 = 1;
    pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_30);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_19,pLVar4);
  }
  if ((local_31 & 1) == 0) {
    if (this->stream_ == (ZeroCopyOutputStream *)0x0) {
      this_local = (EpsCopyOutputStream *)Error(this);
    }
    else if (this->buffer_end_ == (uint8_t *)0x0) {
      *(undefined8 *)this->buffer_ = *(undefined8 *)this->end_;
      *(undefined8 *)(this->buffer_ + 8) = *(undefined8 *)(this->end_ + 8);
      this->buffer_end_ = this->end_;
      this->end_ = this->buffer_ + 0x10;
      this_local = (EpsCopyOutputStream *)this->buffer_;
    }
    else {
      memcpy(this->buffer_end_,this->buffer_,(long)this->end_ - (long)this->buffer_);
      do {
        iVar2 = (*this->stream_->_vptr_ZeroCopyOutputStream[2])
                          (this->stream_,&local_60,(long)&data + 4);
        if ((((byte)iVar2 ^ 0xff) & 1) != 0) {
          puVar3 = Error(this);
          return puVar3;
        }
        pEStack_50 = local_60;
      } while (data._4_4_ == 0);
      if (data._4_4_ < 0x11) {
        if (data._4_4_ < 1) {
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&local_78,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.cc"
                     ,0x363,"size > 0");
          pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_78);
          absl::lts_20250127::log_internal::Voidify::operator&&(&local_61,pLVar4);
          absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                    ((LogMessageFatal *)&local_78);
        }
        uVar1 = *(undefined8 *)(this->end_ + 8);
        *(undefined8 *)this->buffer_ = *(undefined8 *)this->end_;
        *(undefined8 *)(this->buffer_ + 8) = uVar1;
        this->buffer_end_ = (uint8_t *)local_60;
        this->end_ = this->buffer_ + data._4_4_;
        this_local = (EpsCopyOutputStream *)this->buffer_;
      }
      else {
        puVar3 = this->end_;
        local_60->end_ = *(uint8_t **)puVar3;
        local_60->buffer_end_ = *(uint8_t **)(puVar3 + 8);
        this->end_ = local_60->buffer_ + (long)data._4_4_ + -0x20;
        this->buffer_end_ = (uint8_t *)0x0;
        this_local = local_60;
      }
    }
    return (uint8_t *)this_local;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_30);
}

Assistant:

uint8_t* EpsCopyOutputStream::Next() {
  ABSL_DCHECK(!had_error_);  // NOLINT
  if (ABSL_PREDICT_FALSE(stream_ == nullptr)) return Error();
  if (buffer_end_) {
    // We're in the patch buffer and need to fill up the previous buffer.
    std::memcpy(buffer_end_, buffer_, end_ - buffer_);
    uint8_t* ptr;
    int size;
    do {
      void* data;
      if (ABSL_PREDICT_FALSE(!stream_->Next(&data, &size))) {
        // Stream has an error, we use the patch buffer to continue to be
        // able to write.
        return Error();
      }
      ptr = static_cast<uint8_t*>(data);
    } while (size == 0);
    if (ABSL_PREDICT_TRUE(size > kSlopBytes)) {
      std::memcpy(ptr, end_, kSlopBytes);
      end_ = ptr + size - kSlopBytes;
      buffer_end_ = nullptr;
      return ptr;
    } else {
      ABSL_DCHECK(size > 0);  // NOLINT
      // Buffer to small
      std::memmove(buffer_, end_, kSlopBytes);
      buffer_end_ = ptr;
      end_ = buffer_ + size;
      return buffer_;
    }
  } else {
    std::memcpy(buffer_, end_, kSlopBytes);
    buffer_end_ = end_;
    end_ = buffer_ + kSlopBytes;
    return buffer_;
  }
}